

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11Xcb.cpp
# Opt level: O0

void __thiscall tcu::x11::XcbWindow::getDimensions(XcbWindow *this,int *width,int *height)

{
  undefined4 uVar1;
  xcb_connection_t *pxVar2;
  xcb_connection_t *pxVar3;
  void *ptr;
  xcb_get_geometry_reply_t *geom;
  int *height_local;
  int *width_local;
  XcbWindow *this_local;
  
  pxVar2 = XcbDisplay::getConnection(this->m_display);
  pxVar3 = XcbDisplay::getConnection(this->m_display);
  uVar1 = xcb_get_geometry(pxVar3,this->m_window);
  ptr = (void *)xcb_get_geometry_reply(pxVar2,uVar1,0);
  *height = (uint)*(ushort *)((long)ptr + 0x12);
  *width = (uint)*(ushort *)((long)ptr + 0x10);
  deFree(ptr);
  return;
}

Assistant:

void XcbWindow::getDimensions (int* width, int* height) const
{
	xcb_get_geometry_reply_t *geom;
	geom = xcb_get_geometry_reply(m_display.getConnection(), xcb_get_geometry(m_display.getConnection(), m_window), NULL);
	*height = static_cast<int>(geom->height);
	*width = static_cast<int>(geom->width);
	deFree(geom);
}